

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O1

LY_ERR plugins_insert(ly_ctx *ctx,LYPLG type,void *recs)

{
  long lVar1;
  LY_ERR LVar2;
  LY_ERR LVar3;
  lyplg_ext_record *rec;
  ulong uVar4;
  ly_set *plVar5;
  bool bVar6;
  
  LVar3 = LY_SUCCESS;
  if (recs != (void *)0x0) {
    lVar1 = *(long *)((long)recs + 0x10);
    bVar6 = lVar1 == 0;
    if (type == LYPLG_EXTENSION) {
      plVar5 = &plugins_extensions;
      if (ctx != (ly_ctx *)0x0) {
        plVar5 = &ctx->plugins_extensions;
      }
      if ((lVar1 != 0) &&
         (LVar2 = ly_set_add(plVar5,recs,'\0',(uint32_t *)0x0), LVar3 = LVar2, LVar2 == LY_SUCCESS))
      {
        uVar4 = 1;
        do {
          bVar6 = *(long *)((long)recs + uVar4 * 0x70 + 0x10) == 0;
          LVar3 = LVar2;
          if (bVar6) break;
          LVar3 = ly_set_add(plVar5,(void *)(uVar4 * 0x70 + (long)recs),'\0',(uint32_t *)0x0);
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (LVar3 == LY_SUCCESS);
      }
    }
    else {
      plVar5 = &plugins_types;
      if (ctx != (ly_ctx *)0x0) {
        plVar5 = &ctx->plugins_types;
      }
      LVar3 = LY_SUCCESS;
      if ((lVar1 != 0) &&
         (LVar2 = ly_set_add(plVar5,recs,'\0',(uint32_t *)0x0), LVar3 = LVar2, LVar2 == LY_SUCCESS))
      {
        uVar4 = 1;
        do {
          bVar6 = *(long *)((long)recs + uVar4 * 0x60 + 0x10) == 0;
          LVar3 = LVar2;
          if (bVar6) break;
          LVar3 = ly_set_add(plVar5,(void *)(uVar4 * 0x60 + (long)recs),'\0',(uint32_t *)0x0);
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (LVar3 == LY_SUCCESS);
      }
    }
    if (bVar6) {
      LVar3 = LY_SUCCESS;
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
plugins_insert(struct ly_ctx *ctx, enum LYPLG type, const void *recs)
{
    struct ly_set *plugins;

    if (!recs) {
        return LY_SUCCESS;
    }

    if (type == LYPLG_EXTENSION) {
        const struct lyplg_ext_record *rec = (const struct lyplg_ext_record *)recs;

        plugins = ctx ? &ctx->plugins_extensions : &plugins_extensions;

        for (uint32_t i = 0; rec[i].name; i++) {
            LY_CHECK_RET(ly_set_add(plugins, (void *)&rec[i], 0, NULL));
        }
    } else { /* LYPLG_TYPE */
        const struct lyplg_type_record *rec = (const struct lyplg_type_record *)recs;

        plugins = ctx ? &ctx->plugins_types : &plugins_types;

        for (uint32_t i = 0; rec[i].name; i++) {
            LY_CHECK_RET(ly_set_add(plugins, (void *)&rec[i], 0, NULL));
        }
    }

    return LY_SUCCESS;
}